

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

void CollectNodesAndComputePaths_rec
               (DdManager *dd,DdNode *aFunc,DdNode *bCube,st__table *Visited,st__table *CutNodes)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdHalfWord local_64;
  DdNode *bVarTop;
  DdNode *bCube1;
  DdNode *bCube0;
  char **slot;
  traventry *p;
  DdNode *bTemp;
  st__table *CutNodes_local;
  st__table *Visited_local;
  DdNode *bCube_local;
  DdNode *aFunc_local;
  DdManager *dd_local;
  
  bTemp = (DdNode *)CutNodes;
  CutNodes_local = Visited;
  Visited_local = (st__table *)bCube;
  bCube_local = aFunc;
  aFunc_local = &dd->sentinel;
  iVar1 = st__find_or_add(Visited,(char *)aFunc,(char ***)&bCube0);
  if (iVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                  ,0x4c9,
                  "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
                 );
  }
  slot = *(char ***)bCube0;
  if (*(int *)slot < 1) {
    __assert_fail("p->nEdges > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                  ,0x493,
                  "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
                 );
  }
  p = (traventry *)slot[1];
  pDVar2 = Cudd_bddOr((DdManager *)aFunc_local,(DdNode *)p,(DdNode *)Visited_local);
  slot[1] = (char *)pDVar2;
  Cudd_Ref((DdNode *)slot[1]);
  Cudd_RecursiveDeref((DdManager *)aFunc_local,(DdNode *)p);
  *(int *)slot = *(int *)slot + -1;
  if (*(int *)slot == 0) {
    if (bCube_local->index == 0x7fffffff) {
      local_64 = bCube_local->index;
    }
    else {
      local_64 = *(DdHalfWord *)(aFunc_local[7].Id + (ulong)bCube_local->index * 4);
    }
    if ((int)local_64 < s_CutLevel) {
      pDVar2 = *(DdNode **)(&(aFunc_local[8].type.kids.E)->index + (ulong)bCube_local->index * 2);
      n = Cudd_bddAnd((DdManager *)aFunc_local,(DdNode *)slot[1],(DdNode *)((ulong)pDVar2 ^ 1));
      Cudd_Ref(n);
      pDVar2 = Cudd_bddAnd((DdManager *)aFunc_local,(DdNode *)slot[1],pDVar2);
      Cudd_Ref(pDVar2);
      CollectNodesAndComputePaths_rec
                ((DdManager *)aFunc_local,(bCube_local->type).kids.E,n,CutNodes_local,
                 (st__table *)bTemp);
      CollectNodesAndComputePaths_rec
                ((DdManager *)aFunc_local,(bCube_local->type).kids.T,pDVar2,CutNodes_local,
                 (st__table *)bTemp);
      Cudd_RecursiveDeref((DdManager *)aFunc_local,n);
      Cudd_RecursiveDeref((DdManager *)aFunc_local,pDVar2);
    }
    else {
      iVar1 = st__find_or_add((st__table *)bTemp,(char *)bCube_local,(char ***)&bCube0);
      if (iVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                      ,0x4bf,
                      "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
                     );
      }
      *(char **)bCube0 = slot[1];
      Cudd_Ref((DdNode *)slot[1]);
    }
  }
  return;
}

Assistant:

void CollectNodesAndComputePaths_rec( DdManager * dd, DdNode * aFunc, DdNode * bCube, st__table * Visited, st__table * CutNodes )
{   
    // find the node in the visited table
    DdNode * bTemp;
    traventry * p;
    char **slot;
    if ( st__find_or_add(Visited, (char*)aFunc, &slot) )
    { // the node is found
        // get the pointer to the traversal entry
        p = (traventry*) *slot;

        // make sure that the counter of incoming edges is positive
        assert( p->nEdges > 0 );

        // add the cube to the currently accumulated cubes
        p->bSum = Cudd_bddOr( dd, bTemp = p->bSum, bCube );  Cudd_Ref( p->bSum );
        Cudd_RecursiveDeref( dd, bTemp );

        // decrement the number of visits
        p->nEdges--;

        // if more visits to this node are expected, return
        if ( p->nEdges ) 
            return;
        else // if ( p->nEdges == 0 )
        { // this is the last visit - propagate the cube

            // check where this node is
            if ( cuddI(dd,aFunc->index) < s_CutLevel )
            { // the node is above the cut
                DdNode * bCube0, * bCube1;

                // get the top-most variable
                DdNode * bVarTop = dd->vars[aFunc->index];

                // compute the propagated cubes
                bCube0 = Cudd_bddAnd( dd, p->bSum, Cudd_Not( bVarTop ) );   Cudd_Ref( bCube0 );
                bCube1 = Cudd_bddAnd( dd, p->bSum,           bVarTop   );   Cudd_Ref( bCube1 );

                // call recursively
                CollectNodesAndComputePaths_rec( dd, cuddE(aFunc), bCube0, Visited, CutNodes );
                CollectNodesAndComputePaths_rec( dd, cuddT(aFunc), bCube1, Visited, CutNodes );

                // dereference the cubes
                Cudd_RecursiveDeref( dd, bCube0 );
                Cudd_RecursiveDeref( dd, bCube1 );
                return;
            }
            else
            { // the node is below the cut
                // add this node to the cut node table, if it is not yet there

//              DdNode * bNode;
//              bNode = Cudd_addBddPattern( dd, aFunc );  Cudd_Ref( bNode );
                if ( st__find_or_add(CutNodes, (char*)aFunc, &slot) )
                { // the node exists - should never happen
                    assert( 0 );
                }
                *slot = (char*) p->bSum;   Cudd_Ref( p->bSum );
                // the table takes the reference of bNode
                return;
            }
        }
    }

    // the node does not exist in the visited table - should never happen
    assert(0);

}